

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-pipe.c
# Opt level: O3

void lws_plat_pipe_close(lws *wsi)

{
  char cVar1;
  int __fd;
  lws_context *plVar2;
  lws_sockfd_type *plVar3;
  
  plVar2 = (wsi->a).context;
  cVar1 = wsi->tsi;
  plVar3 = plVar2->pt[cVar1].dummy_pipe_fds;
  if (1 < *plVar3 + 1U) {
    close(*plVar3);
  }
  __fd = plVar2->pt[cVar1].dummy_pipe_fds[1];
  if (1 < __fd + 1U) {
    close(__fd);
  }
  plVar3[0] = -1;
  plVar3[1] = -1;
  return;
}

Assistant:

void
lws_plat_pipe_close(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];

	if (pt->dummy_pipe_fds[0] && pt->dummy_pipe_fds[0] != -1)
		close(pt->dummy_pipe_fds[0]);
	if (pt->dummy_pipe_fds[1] && pt->dummy_pipe_fds[1] != -1)
		close(pt->dummy_pipe_fds[1]);

	pt->dummy_pipe_fds[0] = pt->dummy_pipe_fds[1] = -1;
}